

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O0

void number_suite::outer_int(void)

{
  bool bVar1;
  undefined4 local_1a0;
  int local_19c [2];
  undefined4 local_194;
  value local_190 [2];
  basic_string_view<char,_std::char_traits<char>_> local_188;
  undefined4 local_178;
  value local_174 [5];
  basic_string_view<char,_std::char_traits<char>_> local_160;
  undefined1 local_150 [8];
  chunk_reader reader;
  
  trial::protocol::json::basic_chunk_reader<char>::basic_chunk_reader
            ((basic_chunk_reader<char> *)local_150);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"0");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_150,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x3f,"void number_suite::outer_int()",(bool)(~bVar1 & 1));
  local_174[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_178 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x40,"void number_suite::outer_int()",local_174,&local_178);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"0");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::finish
                    ((basic_chunk_reader<char> *)local_150,&local_188);
  boost::detail::test_impl
            ("reader.finish(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x41,"void number_suite::outer_int()",bVar1);
  local_190[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_194 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x42,"void number_suite::outer_int()",local_190,&local_194);
  local_19c[0] = trial::protocol::json::basic_reader<char>::value<int>
                           ((basic_reader<char> *)local_150);
  local_1a0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x43,"void number_suite::outer_int()",local_19c,&local_1a0);
  trial::protocol::json::basic_chunk_reader<char>::~basic_chunk_reader
            ((basic_chunk_reader<char> *)local_150);
  return;
}

Assistant:

void outer_int()
{
    // "0" is legal, but we must specify that we reached the input end
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(!reader.next("0"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized); // Retains old state
    TRIAL_PROTOCOL_TEST(reader.finish("0"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 0);
}